

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O1

void __thiscall glslang::TFunction::addThisParameter(TFunction *this,TType *type,char *name)

{
  TPoolAllocator *pTVar1;
  TString *this_00;
  TType *this_01;
  TParameter p;
  value_type local_40;
  
  pTVar1 = GetThreadPoolAllocator();
  this_00 = (TString *)TPoolAllocator::allocate(pTVar1,0x28);
  local_40.name = (TString *)GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)this_00,name
             ,(pool_allocator<char> *)&local_40);
  local_40.name = this_00;
  pTVar1 = GetThreadPoolAllocator();
  this_01 = (TType *)TPoolAllocator::allocate(pTVar1,0x98);
  TType::TType(this_01,EbtVoid,EvqTemporary,1,0,0,false);
  local_40.defaultValue = (TIntermTyped *)0x0;
  local_40.type = this_01;
  TType::shallowCopy(this_01,type);
  std::vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>::insert
            (&(this->parameters).
              super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>,
             (this->parameters).
             super_vector<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
             super__Vector_base<glslang::TParameter,_glslang::pool_allocator<glslang::TParameter>_>.
             _M_impl.super__Vector_impl_data._M_start,&local_40);
  return;
}

Assistant:

virtual void addThisParameter(TType& type, const char* name)
    {
        TParameter p = { NewPoolTString(name), new TType, nullptr };
        p.type->shallowCopy(type);
        parameters.insert(parameters.begin(), p);
    }